

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

bool __thiscall
LinearSystem::ApplyOperation
          (LinearSystem *this,OperationType operation_type,int lhs,int rhs,Fraction coefficient)

{
  ExtendedMatrix *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Matrix *this_01;
  
  switch(operation_type) {
  case AddRow:
    bVar2 = ExtendedMatrix::AddRow(&this->system_,lhs,rhs,coefficient);
    return bVar2;
  case MultiplyRow:
    bVar2 = ExtendedMatrix::MultiplyRow(&this->system_,lhs,coefficient);
    return bVar2;
  case SwapRows:
    this_00 = &this->system_;
    bVar2 = ExtendedMatrix::SwapRows(this_00,lhs,rhs);
    if (this->mode_ == LU) {
      this_01 = ExtendedMatrix::GetMainMatrix(this_00);
      iVar3 = Matrix::GetNumColumns(this_01);
      bVar1 = ExtendedMatrix::SwapColumns(this_00,lhs + iVar3,rhs + iVar3);
      bVar2 = bVar2 || bVar1;
    }
    break;
  case SwapColumns:
    bVar2 = ExtendedMatrix::SwapColumns(&this->system_,lhs,rhs);
    return bVar2;
  default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool LinearSystem::ApplyOperation(OperationType operation_type, int lhs, int rhs,
                                  Fraction coefficient) {
  if (operation_type == OperationType::AddRow) {
    return system_.AddRow(lhs, rhs, coefficient);
  } else if (operation_type == OperationType::MultiplyRow) {
    return system_.MultiplyRow(lhs, coefficient);
  } else if (operation_type == OperationType::SwapRows) {
    bool result = false;
    result |= system_.SwapRows(lhs, rhs);
    if (mode_ == Mode::LU){
      int m = system_.GetMainMatrix().GetNumColumns();
      result |= system_.SwapColumns(lhs + m, rhs + m);
    }
    return result;
  } else if (operation_type == OperationType::SwapColumns) {
    return system_.SwapColumns(lhs, rhs);
  }

  return false;
}